

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O0

void al_set_new_window_title(char *title)

{
  thread_local_state *src;
  size_t n;
  char *in_RDI;
  size_t size;
  thread_local_state *tls;
  
  src = tls_get();
  if (src != (thread_local_state *)0x0) {
    n = strlen(in_RDI);
    if (0xff < n) {
      n = 0xff;
    }
    _al_sane_strncpy(in_RDI,(char *)src,n);
  }
  return;
}

Assistant:

void al_set_new_window_title(const char *title)
{
   thread_local_state *tls;
   size_t size;

   if ((tls = tls_get()) == NULL)
      return;

   size = strlen(title);

   if (size > ALLEGRO_NEW_WINDOW_TITLE_MAX_SIZE) {
      size = ALLEGRO_NEW_WINDOW_TITLE_MAX_SIZE;
   }

   _al_sane_strncpy(tls->new_window_title, title, size + 1);
}